

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.h
# Opt level: O2

String * kj::_::operator*(String *__return_storage_ptr__,undefined8 *param_2,undefined8 param_3,
                         undefined8 param_4,ArrayPtr<const_char> *param_5)

{
  char *pcVar1;
  ArrayPtr<const_char> local_30;
  StringPtr local_20;
  
  local_30 = toCharSequence<char_const(&)[7]>((char (*) [7])*param_2);
  pcVar1 = (char *)param_2[2];
  local_20.content.ptr = pcVar1;
  if (pcVar1 != (char *)0x0) {
    local_20.content.ptr = (char *)param_2[1];
  }
  local_20.content.size_ = (size_t)(char *)0x0;
  if (pcVar1 != (char *)0x0) {
    local_20.content.size_ = (size_t)(pcVar1 + -1);
  }
  concat<kj::ArrayPtr<char_const>,kj::StringPtr&,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,(_ *)&local_30,(ArrayPtr<const_char> *)(param_2 + 4),&local_20,
             param_5);
  return __return_storage_ptr__;
}

Assistant:

String KJ_STRINGIFY(DebugComparison<Left, Right>& cmp) {
  return _::concat(tryToCharSequence(&cmp.left), cmp.op, tryToCharSequence(&cmp.right));
}